

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::__cxx11::string>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  anon_struct_8_0_00000001_for___align aVar1;
  vtable_type *pvVar2;
  bool bVar3;
  uint32_t uVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  anon_struct_8_0_00000001_for___align local_70;
  long local_60;
  undefined8 uStack_58;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  double local_28;
  
  if (v == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_default_value<std::__cxx11::string>(&local_50,this);
    bVar3 = local_50.has_value_;
    if (local_50.has_value_ == true) {
      local_70 = (anon_struct_8_0_00000001_for___align)&local_60;
      aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_50.contained + 0x10);
      if (local_50.contained.data.__align == aVar1) {
        uStack_58 = local_50.contained._24_8_;
      }
      else {
        local_70 = local_50.contained.data.__align;
      }
      local_60 = CONCAT71(local_50.contained._17_7_,local_50.contained._16_1_);
      local_50.contained._8_8_ = 0;
      local_50.contained._16_1_ = 0;
      local_50.contained.data.__align = aVar1;
    }
    if ((local_50.has_value_ == true) &&
       (std::__cxx11::string::_M_assign((string *)v),
       local_70 != (anon_struct_8_0_00000001_for___align)&local_60)) {
      operator_delete((void *)local_70,local_60 + 1);
    }
    if (bVar3 != false) {
      return true;
    }
    t = local_28;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = tinyusdz::value::TimeSamples::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar3;
  }
  if ((this->_blocked != false) ||
     (((pvVar2 = (this->_value).v_.vtable, pvVar2 == (vtable_type *)0x0 ||
       (uVar4 = (*pvVar2->type_id)(), uVar4 != 0)) &&
      ((pvVar2 = (this->_value).v_.vtable, pvVar2 == (vtable_type *)0x0 ||
       (uVar4 = (*pvVar2->type_id)(), uVar4 != 1)))))) {
    get_default_value<std::__cxx11::string>(&local_50,this);
    if (local_50.has_value_ == true) {
      aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_50.contained + 0x10);
      if (local_50.contained.data.__align == aVar1) {
        uStack_58 = local_50.contained._24_8_;
        local_70 = (anon_struct_8_0_00000001_for___align)&local_60;
      }
      else {
        local_70 = local_50.contained.data.__align;
      }
      local_60 = CONCAT71(local_50.contained._17_7_,local_50.contained._16_1_);
      local_50.contained._8_8_ = 0;
      local_50.contained._16_1_ = 0;
      local_50.contained.data.__align = aVar1;
    }
    if ((local_50.has_value_ == true) &&
       (std::__cxx11::string::_M_assign((string *)v),
       local_70 != (anon_struct_8_0_00000001_for___align)&local_60)) {
      operator_delete((void *)local_70,local_60 + 1);
    }
    if (local_50.has_value_ != false) {
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }